

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::TraverseSchema::genAnonTypeName(TraverseSchema *this,XMLCh *prefix)

{
  XMLStringPool *pXVar1;
  XMLStringPool *pXVar2;
  uint uVar3;
  int iVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLCh local_38 [4];
  XMLCh anonCountStr [16];
  XMLCh *prefix_local;
  TraverseSchema *this_local;
  
  uVar3 = this->fAnonXSTypeCount;
  this->fAnonXSTypeCount = uVar3 + 1;
  anonCountStr._24_8_ = prefix;
  XMLString::sizeToText((ulong)uVar3,local_38,0xf,10,this->fMemoryManager);
  XMLBuffer::set(&this->fBuffer,(XMLCh *)anonCountStr._24_8_);
  XMLBuffer::append(&this->fBuffer,local_38);
  pXVar1 = this->fStringPool;
  pXVar2 = this->fStringPool;
  pXVar5 = XMLBuffer::getRawBuffer(&this->fBuffer);
  uVar3 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar5);
  iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
  return (XMLCh *)CONCAT44(extraout_var,iVar4);
}

Assistant:

inline const XMLCh* TraverseSchema::genAnonTypeName(const XMLCh* const prefix) {

    XMLCh anonCountStr[16]; // a count of 15 digits should be enough

    XMLString::sizeToText(fAnonXSTypeCount++, anonCountStr, 15, 10, fMemoryManager);
    fBuffer.set(prefix);
    fBuffer.append(anonCountStr);

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}